

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

xmlHashTablePtr xmlHashCreateDict(int size,xmlDictPtr dict)

{
  xmlHashTablePtr pxVar1;
  
  pxVar1 = xmlHashCreate(size);
  if (pxVar1 != (xmlHashTablePtr)0x0) {
    pxVar1->dict = dict;
    xmlDictReference(dict);
  }
  return pxVar1;
}

Assistant:

xmlHashTablePtr
xmlHashCreateDict(int size, xmlDictPtr dict) {
    xmlHashTablePtr hash;

    hash = xmlHashCreate(size);
    if (hash != NULL) {
        hash->dict = dict;
        xmlDictReference(dict);
    }
    return(hash);
}